

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O0

QDBusPlatformMenuItem * __thiscall
QDBusMenuBar::menuItemForMenu(QDBusMenuBar *this,QPlatformMenu *menu)

{
  long lVar1;
  bool bVar2;
  QDBusPlatformMenuItem **ppQVar3;
  QDBusPlatformMenuItem *item_00;
  long *in_RSI;
  QDBusPlatformMenuItem *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *item;
  const_iterator it;
  quintptr tag;
  unsigned_long_long *in_stack_ffffffffffffff88;
  const_iterator *in_stack_ffffffffffffff90;
  QPlatformMenu *in_stack_ffffffffffffffc0;
  QDBusPlatformMenuItem *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (long *)0x0) {
    pQVar4 = (QDBusPlatformMenuItem *)0x0;
  }
  else {
    (**(code **)(*in_RSI + 0x88))();
    QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::constFind
              ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::cend
              ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)in_RDI);
    bVar2 = QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::const_iterator::operator!=
                      ((const_iterator *)in_RDI,in_stack_ffffffffffffff90);
    if (bVar2) {
      ppQVar3 = QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::const_iterator::operator*
                          ((const_iterator *)0xaedcaf);
      pQVar4 = *ppQVar3;
    }
    else {
      item_00 = (QDBusPlatformMenuItem *)operator_new(0x50);
      QDBusPlatformMenuItem::QDBusPlatformMenuItem(in_RDI);
      pQVar4 = item_00;
      updateMenuItem(item_00,in_stack_ffffffffffffffc0);
      QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::insert
                ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)item_00,
                 in_stack_ffffffffffffff88,(QDBusPlatformMenuItem **)0xaedd01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QDBusPlatformMenuItem *QDBusMenuBar::menuItemForMenu(QPlatformMenu *menu)
{
    if (!menu)
        return nullptr;
    quintptr tag = menu->tag();
    const auto it = m_menuItems.constFind(tag);
    if (it != m_menuItems.cend()) {
        return *it;
    } else {
        QDBusPlatformMenuItem *item = new QDBusPlatformMenuItem;
        updateMenuItem(item, menu);
        m_menuItems.insert(tag, item);
        return item;
    }
}